

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O1

bool check_all_vis_and_in_group(Am_Value *obj_list_value,Am_Object *group,bool want_in_sub)

{
  bool bVar1;
  bool bVar2;
  Am_Value *in_value;
  undefined7 in_register_00000011;
  byte unaff_R15B;
  Am_Object obj_group;
  Am_Object obj;
  Am_Value_List grouped_objs;
  Am_Object local_70;
  Am_Object local_68;
  undefined4 local_5c;
  Am_Value_List local_58;
  Am_Object local_48;
  Am_Value local_40;
  
  local_5c = (undefined4)CONCAT71(in_register_00000011,want_in_sub);
  bVar1 = Am_Object::Valid(group);
  if (bVar1) {
    local_68.data = (Am_Object_Data *)0x0;
    local_70.data = (Am_Object_Data *)0x0;
    Am_Value::Am_Value(&local_40,obj_list_value);
    bVar1 = Am_Valid_and_Visible_List_Or_Object(&local_40,true);
    Am_Value::~Am_Value(&local_40);
    if (bVar1) {
      Am_Value_List::Am_Value_List(&local_58);
      Am_Value_List::operator=(&local_58,obj_list_value);
      Am_Value_List::Start(&local_58);
      while( true ) {
        unaff_R15B = Am_Value_List::Last(&local_58);
        if ((bool)unaff_R15B) break;
        in_value = Am_Value_List::Get(&local_58);
        Am_Object::operator=(&local_68,in_value);
        Am_Object::Get_Object(&local_48,(Am_Slot_Key)&local_68,10);
        Am_Object::operator=(&local_70,&local_48);
        Am_Object::~Am_Object(&local_48);
        bVar2 = Am_Object::operator==(&local_70,group);
        if (bVar2 == (bool)(char)local_5c) break;
        Am_Value_List::Next(&local_58);
      }
      Am_Value_List::~Am_Value_List(&local_58);
    }
    Am_Object::~Am_Object(&local_70);
    Am_Object::~Am_Object(&local_68);
    if (bVar1) goto LAB_0023deaf;
  }
  unaff_R15B = 0;
LAB_0023deaf:
  return (bool)(unaff_R15B & 1);
}

Assistant:

bool
check_all_vis_and_in_group(Am_Value obj_list_value, Am_Object group,
                           bool want_in_sub)
{
  if (group.Valid()) {
    Am_Object obj, obj_group;
    bool ret = Am_Valid_and_Visible_List_Or_Object(obj_list_value, true);
    if (ret) {
      //now check that none are in a sub-group
      Am_Value_List grouped_objs;
      grouped_objs = obj_list_value;
      for (grouped_objs.Start(); !grouped_objs.Last(); grouped_objs.Next()) {
        obj = grouped_objs.Get();
        obj_group = obj.Get_Owner();
        if ((obj_group == group) == want_in_sub)
          return false;
      }
      return true;
    }
  }
  return false;
}